

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O1

BOOL __thiscall Js::JavascriptProxy::HasOwnProperty(JavascriptProxy *this,PropertyId propertyId)

{
  ScriptContext *requestContext;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  JavascriptProxy *this_00;
  undefined1 local_58 [8];
  PropertyDescriptor propertyDesc;
  
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar4 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                              ,0x1e6,"(0)","FALSE");
  if (bVar2) {
    *puVar4 = 0;
    PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_58);
    requestContext =
         (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
         super_JavascriptLibraryBase).scriptContext.ptr;
    this_00 = VarTo<Js::JavascriptProxy,Js::RecyclableObject>((RecyclableObject *)this);
    BVar3 = GetPropertyDescriptorTrap
                      (this_00,propertyId,(PropertyDescriptor *)local_58,requestContext);
    return BVar3;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

BOOL JavascriptProxy::HasOwnProperty(PropertyId propertyId)
    {
        // should never come here and it will be redirected to GetOwnPropertyDescriptor
        Assert(FALSE);
        PropertyDescriptor propertyDesc;
        return GetOwnPropertyDescriptor(this, propertyId, GetScriptContext(), &propertyDesc);
    }